

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Decoder.cpp
# Opt level: O3

vector<int,_std::allocator<int>_> * __thiscall
FBX::Decoder::readArray<int>
          (vector<int,_std::allocator<int>_> *__return_storage_ptr__,Decoder *this)

{
  size_t sVar1;
  uint uVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  size_t sVar6;
  ulong uVar7;
  Span<char> local_48;
  vector<int,_std::allocator<int>_> local_38;
  
  pcVar5 = (this->stream).data;
  sVar6 = (this->stream).cursor;
  uVar2 = *(uint *)(pcVar5 + sVar6);
  iVar3 = *(int *)(pcVar5 + sVar6 + 4);
  sVar1 = sVar6 + 0xc;
  (this->stream).cursor = sVar1;
  uVar4 = *(uint *)(pcVar5 + sVar6 + 8);
  uVar7 = (ulong)uVar4;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  if (iVar3 == 1) {
    local_48.begin = pcVar5 + sVar1;
    local_48.end = local_48.begin + uVar7;
    (this->stream).cursor = sVar1 + uVar7;
    decompress<int>(&local_38,this,&local_48);
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_start =
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_finish =
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_finish;
    (__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
    super__Vector_impl_data._M_end_of_storage =
         local_38.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_end_of_storage;
  }
  else {
    (this->stream).cursor = sVar1 + uVar7;
    std::vector<int,_std::allocator<int>_>::resize(__return_storage_ptr__,(ulong)uVar2);
    memcpy((__return_storage_ptr__->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
           super__Vector_impl_data._M_start,pcVar5 + sVar1,(ulong)(uVar4 & 0xfffffffc));
  }
  return __return_storage_ptr__;
}

Assistant:

std::vector<T> Decoder::readArray() {
        size_t arraySize = stream.read<std::uint32_t>();
        size_t encoding = stream.read<std::uint32_t>();
        size_t completeLength = stream.read<std::uint32_t>();

        std::vector<T> buffer;
        if (encoding == 1)
            buffer = decompress<T>(stream.read<char>(completeLength));
        else {
            auto data = stream.read<T>(completeLength);
            buffer.resize(arraySize);
            std::memcpy(buffer.data(), data.begin, data.size() * sizeof(T));
        }

        return buffer;
    }